

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  _Bool connected;
  void *pvVar1;
  curl_wildcard_dtor p_Var2;
  undefined8 *puVar3;
  Curl_easy *data;
  CURLcode CVar4;
  CURLcode CVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar9;
  curl_wildcard_states cVar10;
  Curl_easy *pCVar11;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pCVar11 = conn->data;
  if ((pCVar11->state).wildcardmatch == true) {
    CVar5 = CURLE_OUT_OF_MEMORY;
    do {
      switch((pCVar11->wildcard).state) {
      case CURLWC_CLEAR:
      case CURLWC_ERROR:
      case CURLWC_DONE:
        goto switchD_00114301_caseD_0;
      case CURLWC_INIT:
        pvVar1 = (pCVar11->req).protop;
        pcVar6 = *(char **)((long)pvVar1 + 0x18);
        pcVar8 = strrchr(pcVar6,0x2f);
        if (pcVar8 == (char *)0x0) {
          if (*pcVar6 == '\0') goto LAB_001146d8;
          pcVar8 = (*Curl_cstrdup)(pcVar6);
          (pCVar11->wildcard).pattern = pcVar8;
LAB_001145e2:
          if (pcVar8 == (char *)0x0) {
            CVar5 = CURLE_OUT_OF_MEMORY;
          }
          else {
            *pcVar6 = '\0';
            parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
            if (parserp == (ftp_parselist_data **)0x0) {
              CVar5 = CURLE_OUT_OF_MEMORY;
            }
            else {
              pfVar9 = Curl_ftp_parselist_data_alloc();
              *parserp = pfVar9;
              if (pfVar9 == (ftp_parselist_data *)0x0) {
                CVar5 = CURLE_OUT_OF_MEMORY;
              }
              else {
                (pCVar11->wildcard).protdata = parserp;
                (pCVar11->wildcard).dtor = wc_data_dtor;
                if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
                  (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
                }
                CVar5 = ftp_parse_url_path(conn);
                if (CVar5 == CURLE_OK) {
                  pcVar6 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 0x18));
                  (pCVar11->wildcard).path = pcVar6;
                  CVar5 = CURLE_OUT_OF_MEMORY;
                  if (pcVar6 != (char *)0x0) {
                    data = conn->data;
                    parserp[1] = (ftp_parselist_data *)(data->set).fwrite_func;
                    (data->set).fwrite_func = Curl_ftp_parselist;
                    parserp[2] = (ftp_parselist_data *)(data->set).out;
                    (data->set).out = conn;
                    CVar5 = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started\n");
                    goto LAB_00114780;
                  }
                }
              }
              Curl_ftp_parselist_data_free(parserp);
              (*Curl_cfree)(parserp);
            }
            (*Curl_cfree)((pCVar11->wildcard).pattern);
            (pCVar11->wildcard).pattern = (char *)0x0;
            (pCVar11->wildcard).protdata = (void *)0x0;
            (pCVar11->wildcard).dtor = (curl_wildcard_dtor)0x0;
          }
        }
        else {
          if (pcVar8[1] != '\0') {
            pcVar6 = pcVar8 + 1;
            pcVar8 = (*Curl_cstrdup)(pcVar6);
            (pCVar11->wildcard).pattern = pcVar8;
            goto LAB_001145e2;
          }
LAB_001146d8:
          (pCVar11->wildcard).state = CURLWC_CLEAN;
          CVar5 = ftp_parse_url_path(conn);
        }
LAB_00114780:
        if ((pCVar11->wildcard).state != CURLWC_CLEAN) {
          (pCVar11->wildcard).state = (uint)(CVar5 != CURLE_OK) * 4 + CURLWC_MATCHING;
        }
        goto LAB_001147a1;
      case CURLWC_MATCHING:
        puVar3 = (undefined8 *)(pCVar11->wildcard).protdata;
        (pCVar11->set).fwrite_func = (curl_write_callback)puVar3[1];
        (pCVar11->set).out = (void *)puVar3[2];
        puVar3[1] = 0;
        puVar3[2] = 0;
        (pCVar11->wildcard).state = CURLWC_DOWNLOADING;
        CVar4 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
        cVar10 = CURLWC_CLEAN;
        if (CVar4 != CURLE_OK) break;
        if ((pCVar11->wildcard).filelist.size != 0) goto LAB_00114494;
        (pCVar11->wildcard).state = CURLWC_CLEAN;
        CVar5 = CURLE_REMOTE_FILE_NOT_FOUND;
        goto LAB_001147a1;
      case CURLWC_DOWNLOADING:
        puVar3 = (undefined8 *)((pCVar11->wildcard).filelist.head)->ptr;
        pvVar1 = (pCVar11->req).protop;
        pcVar6 = curl_maprintf("%s%s",(pCVar11->wildcard).path,*puVar3);
        if (pcVar6 == (char *)0x0) goto LAB_001147a1;
        (*Curl_cfree)(*(void **)((long)pvVar1 + 0x20));
        *(char **)((long)pvVar1 + 0x18) = pcVar6;
        *(char **)((long)pvVar1 + 0x20) = pcVar6;
        Curl_infof(conn->data,"Wildcard - START of \"%s\"\n",*puVar3);
        if ((conn->data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
          Curl_set_in_callback(conn->data,true);
          lVar7 = (*(conn->data->set).chunk_bgn)
                            (puVar3,(pCVar11->wildcard).customptr,
                             (int)(pCVar11->wildcard).filelist.size);
          Curl_set_in_callback(conn->data,false);
          if (lVar7 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar3);
            cVar10 = CURLWC_SKIP;
            break;
          }
          if (lVar7 == 1) {
            CVar5 = CURLE_CHUNK_FAILED;
            goto LAB_001147a1;
          }
        }
        cVar10 = CURLWC_SKIP;
        if (*(int *)(puVar3 + 1) == 0) {
          if ((*(byte *)(puVar3 + 0xc) & 0x40) != 0) {
            (conn->proto).ftpc.known_filesize = puVar3[5];
          }
          CVar5 = ftp_parse_url_path(conn);
          if (CVar5 == CURLE_OK) {
            CVar5 = CURLE_OK;
            Curl_llist_remove(&(pCVar11->wildcard).filelist,(pCVar11->wildcard).filelist.head,
                              (void *)0x0);
            if ((pCVar11->wildcard).filelist.size == 0) {
              (pCVar11->wildcard).state = CURLWC_CLEAN;
            }
          }
          goto LAB_001147a1;
        }
        break;
      case CURLWC_CLEAN:
        puVar3 = (undefined8 *)(pCVar11->wildcard).protdata;
        if (puVar3 == (undefined8 *)0x0) {
          cVar10 = CURLWC_DONE;
          CVar5 = CURLE_OK;
        }
        else {
          CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
          cVar10 = (CVar5 == CURLE_OK) + CURLWC_ERROR;
        }
        (pCVar11->wildcard).state = cVar10;
        goto LAB_001147a1;
      case CURLWC_SKIP:
        if ((pCVar11->set).chunk_end != (curl_chunk_end_callback)0x0) {
          Curl_set_in_callback(pCVar11,true);
          (*(conn->data->set).chunk_end)((conn->data->wildcard).customptr);
          Curl_set_in_callback(conn->data,false);
        }
        Curl_llist_remove(&(pCVar11->wildcard).filelist,(pCVar11->wildcard).filelist.head,
                          (void *)0x0);
        cVar10 = ((pCVar11->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
        break;
      default:
        goto switchD_00114301_default;
      }
      (pCVar11->wildcard).state = cVar10;
LAB_00114494:
      pCVar11 = conn->data;
    } while( true );
  }
  CVar5 = ftp_parse_url_path(conn);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pCVar11 = conn->data;
LAB_001147c6:
  (pCVar11->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar11,0);
  Curl_pgrsSetDownloadCounter(pCVar11,0);
  Curl_pgrsSetUploadSize(pCVar11,-1);
  Curl_pgrsSetDownloadSize(pCVar11,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x28) = 1;
  }
  *done = false;
  CVar5 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar5 == CURLE_OK) {
    CVar5 = ftp_multi_statemach(conn,done);
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar5 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar5 = ftp_dophase_done(conn,connected);
      return CVar5;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar5;
switchD_00114301_caseD_0:
  p_Var2 = (pCVar11->wildcard).dtor;
  CVar5 = CURLE_OK;
  if (p_Var2 != (curl_wildcard_dtor)0x0) {
    (*p_Var2)((pCVar11->wildcard).protdata);
switchD_00114301_default:
    CVar5 = CURLE_OK;
  }
LAB_001147a1:
  pCVar11 = conn->data;
  if (((pCVar11->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  goto LAB_001147c6;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->state.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}